

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_value_extend_Test::TestBody(sim_value_extend_Test *this)

{
  bool bVar1;
  int iVar2;
  Generator *pGVar3;
  Var *pVVar4;
  undefined4 extraout_var;
  Var *this_00;
  undefined4 extraout_var_00;
  Var *var;
  char *pcVar5;
  unsigned_long *lhs;
  char *in_R9;
  optional<unsigned_long> oVar6;
  AssertHelper local_430;
  Message local_428;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_;
  optional<unsigned_long> res;
  undefined1 local_3a8 [12];
  undefined1 local_398 [8];
  Simulator sim;
  shared_ptr<kratos::Stmt> local_1e0;
  allocator<char> local_1c9;
  string local_1c8;
  Var *local_1a8;
  Var *b;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_value_extend_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a",(allocator<char> *)((long)&b + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_198,2);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  pGVar3 = local_138;
  local_178 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"b",&local_1c9);
  pVVar4 = kratos::Generator::var(pGVar3,&local_1c8,2);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pGVar3 = local_138;
  local_1a8 = pVVar4;
  iVar2 = (*(local_178->super_IRNode)._vptr_IRNode[9])(local_178,0);
  this_00 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x60))
                             ((long *)CONCAT44(extraout_var,iVar2),2);
  iVar2 = (*(local_178->super_IRNode)._vptr_IRNode[9])(local_178,1);
  var = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x60))
                         ((long *)CONCAT44(extraout_var_00,iVar2),2);
  kratos::Var::operator+(this_00,var);
  kratos::Var::assign((Var *)&sim.simulation_depth_,pVVar4);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_1e0,(shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Generator::add_stmt(pGVar3,&local_1e0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_1e0);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator((Simulator *)local_398,local_138);
  pVVar4 = local_178;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 2;
  std::optional<unsigned_long>::optional<int,_true>
            ((optional<unsigned_long> *)local_3a8,
             (int *)&res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>.field_0xc);
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_3a8._0_8_;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_3a8[8];
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_3a8._9_3_;
  kratos::Simulator::set((Simulator *)local_398,pVVar4,oVar6,true);
  oVar6 = kratos::Simulator::get((Simulator *)local_398,local_1a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_3d1 = std::operator!=(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3d0,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x33,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  lhs = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar_.message_);
  local_41c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_418,"*res","1",lhs,&local_41c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x34,pcVar5);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  kratos::Simulator::~Simulator((Simulator *)local_398);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, value_extend) {   // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 2);
    auto &b = mod.var("b", 2);
    mod.add_stmt(b.assign(a[0].extend(2) + a[1].extend(2)));

    Simulator sim(&mod);
    sim.set(&a, 2);
    auto res = sim.get(&b);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, 1);
}